

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O0

UINT8 device_start_ymz280b(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  void *pvVar1;
  ymz280b_state *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x2e8);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    compute_tables();
    ((DEV_DATA *)((long)devData.chipInf + 0x2c0))->chipInf = (void *)((double)cfg->clock / 384.0);
    pvVar1 = ((DEV_DATA *)((long)devData.chipInf + 0x2c0))->chipInf;
    ((DEV_DATA *)((long)devData.chipInf + 0x2c8))->chipInf =
         (void *)((double)pvVar1 + (double)pvVar1);
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0x2d8))->chipInf = 0;
    ((DEV_DATA *)((long)devData.chipInf + 0x2d0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x298))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x2a0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x2a8))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x2b0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)devData.chipInf + 0x2b8))->chipInf = (void *)0x0;
    pvVar1 = calloc(10000,2);
    ((DEV_DATA *)((long)devData.chipInf + 0x2e0))->chipInf = pvVar1;
    ymz280b_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,
                (UINT32)(long)*(double *)((long)devData.chipInf + 0x2c8),&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_ymz280b(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ymz280b_state *chip;

	chip = (ymz280b_state *)calloc(1, sizeof(ymz280b_state));
	if (chip == NULL)
		return 0xFF;

	/* compute ADPCM tables */
	compute_tables();

	/* initialize the rest of the structure */
	chip->master_clock = (double)cfg->clock / 384.0;
	chip->rate = chip->master_clock * 2.0;
	// disabled until the frequency calculation gets fixed
	//SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->rate, cfg->smplRate);
	
	chip->mem_size = 0x00;
	chip->mem_base = NULL;
	chip->irq_handler = NULL;
	chip->irq_param = NULL;
	chip->ext_read_handler = NULL;
	chip->ext_write_handler = NULL;
	chip->ext_param = NULL;

	/* allocate memory */
	chip->scratch = (INT16*)calloc(MAX_SAMPLE_CHUNK, sizeof(INT16));

	ymz280b_set_mute_mask(chip, 0x00);

	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, (UINT32)INTERNAL_SAMPLE_RATE, &devDef);

	return 0x00;
}